

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_parser.cpp
# Opt level: O2

void embree::parseComments(Ref<embree::Stream<embree::Token>_> *cin)

{
  bool bVar1;
  Token *pTVar2;
  runtime_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_f8;
  string local_d8;
  string local_b8;
  string local_98;
  Token local_78;
  
  do {
    pTVar2 = Stream<embree::Token>::peek(cin->ptr);
    std::__cxx11::string::string((string *)&local_d8,"<!--",(allocator *)&bStack_f8);
    Token::Sym(&local_78,&local_d8);
    bVar1 = operator==(pTVar2,&local_78);
    Token::~Token(&local_78);
    std::__cxx11::string::~string((string *)&local_d8);
    if (!bVar1) {
      return;
    }
    while( true ) {
      Stream<embree::Token>::drop(cin->ptr);
      pTVar2 = Stream<embree::Token>::peek(cin->ptr);
      std::__cxx11::string::string((string *)&local_98,"-->",(allocator *)&bStack_f8);
      Token::Sym(&local_78,&local_98);
      bVar1 = operator!=(pTVar2,&local_78);
      Token::~Token(&local_78);
      std::__cxx11::string::~string((string *)&local_98);
      if (!bVar1) break;
      pTVar2 = Stream<embree::Token>::peek(cin->ptr);
      Token::Eof();
      bVar1 = operator==(pTVar2,&local_78);
      Token::~Token(&local_78);
      if (bVar1) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        Stream<embree::Token>::get(&local_78,cin->ptr);
        ParseLocation::str_abi_cxx11_(&local_b8,&local_78.loc);
        std::operator+(&bStack_f8,&local_b8,": --> expected");
        std::runtime_error::runtime_error(this,(string *)&bStack_f8);
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    Stream<embree::Token>::drop(cin->ptr);
  } while( true );
}

Assistant:

void parseComments(Ref<Stream<Token> >& cin)
  {
    while (cin->peek() == Token::Sym("<!--")) {
      cin->drop();
      while (cin->peek() != Token::Sym("-->")) {
        if (cin->peek() == Token::Eof())
          THROW_RUNTIME_ERROR(cin->get().Location().str()+": --> expected");
        cin->drop();
      }
      cin->drop();
    }
  }